

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void bitset_flip_list(uint64_t *words,uint16_t *list,uint64_t length)

{
  long lVar1;
  
  if (length != 0) {
    lVar1 = 0;
    do {
      words[*(ushort *)((long)list + lVar1) >> 6] =
           words[*(ushort *)((long)list + lVar1) >> 6] ^
           1L << ((byte)*(ushort *)((long)list + lVar1) & 0x3f);
      lVar1 = lVar1 + 2;
    } while (length * 2 != lVar1);
  }
  return;
}

Assistant:

void bitset_flip_list(uint64_t *words, const uint16_t *list, uint64_t length) {
    uint64_t offset, load, newload, pos, index;
    const uint16_t *end = list + length;
    while (list != end) {
        pos = *list;
        offset = pos >> 6;
        index = pos % 64;
        load = words[offset];
        newload = load ^ (UINT64_C(1) << index);
        words[offset] = newload;
        list++;
    }
}